

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O2

CMutableTransaction * __thiscall
TestChain100Setup::CreateValidMempoolTransaction
          (CMutableTransaction *__return_storage_ptr__,TestChain100Setup *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *input_transactions,vector<COutPoint,_std::allocator<COutPoint>_> *inputs,int input_height
          ,vector<CKey,_std::allocator<CKey>_> *input_signing_keys,
          vector<CTxOut,_std::allocator<CTxOut>_> *outputs,bool submit)

{
  long lVar1;
  ChainstateManager *this_00;
  long in_FS_OFFSET;
  undefined1 auStack_128 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  MempoolAcceptResult result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock28.super_unique_lock._M_owns = false;
  auStack_128[4] = false;
  CreateValidTransaction
            ((pair<CMutableTransaction,_long> *)&result,(TestChain100Setup *)0x0,input_transactions,
             inputs,input_height,input_signing_keys,outputs,(optional<CFeeRate> *)&criticalblock28,
             (optional<unsigned_int> *)auStack_128);
  CMutableTransaction::CMutableTransaction(__return_storage_ptr__,(CMutableTransaction *)&result);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&result);
  if (submit) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock28,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
               ,0x1de,false);
    this_00 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
              chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)auStack_128);
    ChainstateManager::ProcessTransaction(&result,this_00,(CTransactionRef *)auStack_128,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
    if (result.m_result_type != VALID) {
      __assert_fail("result.m_result_type == MempoolAcceptResult::ResultType::VALID",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1e0,
                    "CMutableTransaction TestChain100Setup::CreateValidMempoolTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, bool)"
                   );
    }
    MempoolAcceptResult::~MempoolAcceptResult(&result);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock28.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CMutableTransaction TestChain100Setup::CreateValidMempoolTransaction(const std::vector<CTransactionRef>& input_transactions,
                                                                     const std::vector<COutPoint>& inputs,
                                                                     int input_height,
                                                                     const std::vector<CKey>& input_signing_keys,
                                                                     const std::vector<CTxOut>& outputs,
                                                                     bool submit)
{
    CMutableTransaction mempool_txn = CreateValidTransaction(input_transactions, inputs, input_height, input_signing_keys, outputs, std::nullopt, std::nullopt).first;
    // If submit=true, add transaction to the mempool.
    if (submit) {
        LOCK(cs_main);
        const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(MakeTransactionRef(mempool_txn));
        assert(result.m_result_type == MempoolAcceptResult::ResultType::VALID);
    }
    return mempool_txn;
}